

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O0

HPDF_Stream
HPDF_CallbackReader_New
          (HPDF_MMgr mmgr,HPDF_Stream_Read_Func read_fn,HPDF_Stream_Seek_Func seek_fn,
          HPDF_Stream_Tell_Func tell_fn,HPDF_Stream_Size_Func size_fn,void *data)

{
  HPDF_Stream s;
  HPDF_Stream stream;
  void *data_local;
  HPDF_Stream_Size_Func size_fn_local;
  HPDF_Stream_Tell_Func tell_fn_local;
  HPDF_Stream_Seek_Func seek_fn_local;
  HPDF_Stream_Read_Func read_fn_local;
  HPDF_MMgr mmgr_local;
  
  s = (HPDF_Stream)HPDF_GetMem(mmgr,0x58);
  if (s != (HPDF_Stream)0x0) {
    HPDF_MemSet(s,'\0',0x58);
    s->sig_bytes = 0x5354524d;
    s->error = mmgr->error;
    s->mmgr = mmgr;
    s->read_fn = read_fn;
    s->seek_fn = seek_fn;
    s->tell_fn = tell_fn;
    s->size_fn = size_fn;
    s->attr = data;
    s->type = HPDF_STREAM_CALLBACK;
  }
  return s;
}

Assistant:

HPDF_Stream
HPDF_CallbackReader_New  (HPDF_MMgr              mmgr,
                          HPDF_Stream_Read_Func  read_fn,
                          HPDF_Stream_Seek_Func  seek_fn,
                          HPDF_Stream_Tell_Func  tell_fn,
                          HPDF_Stream_Size_Func  size_fn,
                          void*                  data)
{
    HPDF_Stream stream;

    HPDF_PTRACE((" HPDF_CallbackReader_New\n"));

    stream = (HPDF_Stream)HPDF_GetMem (mmgr, sizeof(HPDF_Stream_Rec));

    if (stream) {
        HPDF_MemSet (stream, 0, sizeof(HPDF_Stream_Rec));
        stream->sig_bytes = HPDF_STREAM_SIG_BYTES;
        stream->error = mmgr->error;
        stream->mmgr = mmgr;
        stream->read_fn = read_fn;
        stream->seek_fn = seek_fn;
        stream->tell_fn = tell_fn;
        stream->size_fn = size_fn;
        stream->attr = data;
        stream->type = HPDF_STREAM_CALLBACK;
    }

    return stream;
}